

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

size_t mpack_expect_utf8(mpack_reader_t *reader,char *buf,size_t size)

{
  _Bool _Var1;
  size_t bytes;
  
  bytes = mpack_expect_str_buf(reader,buf,size);
  _Var1 = mpack_utf8_check(buf,bytes);
  if (!_Var1) {
    mpack_reader_flag_error(reader,mpack_error_type);
    bytes = 0;
  }
  return bytes;
}

Assistant:

size_t mpack_expect_utf8(mpack_reader_t* reader, char* buf, size_t size) {
    mpack_assert(buf != NULL, "buf cannot be NULL");

    size_t length = mpack_expect_str_buf(reader, buf, size);

    if (!mpack_utf8_check(buf, length)) {
        mpack_reader_flag_error(reader, mpack_error_type);
        return 0;
    }

    return length;
}